

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O1

bool __thiscall dg::array_match(dg *this,StringRef name,char **names)

{
  int iVar1;
  char *__n;
  char *__s;
  ulong uVar2;
  bool bVar3;
  
  __s = *(char **)name.Length;
  bVar3 = __s != (char *)0x0;
  if (bVar3) {
    uVar2 = 1;
    do {
      __n = (char *)strlen(__s);
      if (__n == name.Data) {
        if (__n == (char *)0x0) {
          return bVar3;
        }
        iVar1 = bcmp(this,__s,(size_t)__n);
        if (iVar1 == 0) {
          return bVar3;
        }
      }
      __s = (char *)((long *)name.Length)[uVar2];
      uVar2 = (ulong)((int)uVar2 + 1);
      bVar3 = __s != (char *)0x0;
    } while (bVar3);
  }
  return bVar3;
}

Assistant:

static bool array_match(llvm::StringRef name, const char *names[]) {
    unsigned idx = 0;
    while (names[idx]) {
        if (name.equals(names[idx]))
            return true;
        ++idx;
    }

    return false;
}